

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O3

FT_Error FT_GlyphSlot_Own_Bitmap(FT_GlyphSlot slot)

{
  FT_UInt *pFVar1;
  FT_Bitmap *source;
  FT_Error FVar2;
  FT_Error FVar3;
  FT_Bitmap bitmap;
  FT_Bitmap local_48;
  
  FVar3 = 0;
  FVar2 = 0;
  if (((slot != (FT_GlyphSlot)0x0) && (FVar2 = FVar3, slot->format == FT_GLYPH_FORMAT_BITMAP)) &&
     ((slot->internal->flags & 1) == 0)) {
    local_48.buffer = (uchar *)0x0;
    local_48.num_grays = 0;
    local_48.pixel_mode = '\0';
    local_48.palette_mode = '\0';
    local_48._28_4_ = 0;
    local_48.rows = 0;
    local_48.width = 0;
    local_48.pitch = 0;
    local_48._12_4_ = 0;
    local_48.palette = (void *)0x0;
    source = &slot->bitmap;
    FVar2 = FT_Bitmap_Copy(slot->library,source,&local_48);
    if (FVar2 == 0) {
      (slot->bitmap).palette = local_48.palette;
      (slot->bitmap).buffer = local_48.buffer;
      (slot->bitmap).num_grays = local_48.num_grays;
      (slot->bitmap).pixel_mode = local_48.pixel_mode;
      (slot->bitmap).palette_mode = local_48.palette_mode;
      *(undefined4 *)&(slot->bitmap).field_0x1c = local_48._28_4_;
      source->rows = local_48.rows;
      source->width = local_48.width;
      (slot->bitmap).pitch = local_48.pitch;
      *(undefined4 *)&(slot->bitmap).field_0xc = local_48._12_4_;
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 | 1;
      FVar2 = FVar3;
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_GlyphSlot_Own_Bitmap( FT_GlyphSlot  slot )
  {
    if ( slot && slot->format == FT_GLYPH_FORMAT_BITMAP   &&
         !( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
    {
      FT_Bitmap  bitmap;
      FT_Error   error;


      FT_Bitmap_Init( &bitmap );
      error = FT_Bitmap_Copy( slot->library, &slot->bitmap, &bitmap );
      if ( error )
        return error;

      slot->bitmap = bitmap;
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;
    }

    return FT_Err_Ok;
  }